

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateRecorder::Impl::copy_descriptor_set_layout
          (Impl *this,VkDescriptorSetLayoutCreateInfo *create_info,ScratchAllocator *alloc,
          VkDescriptorSetLayoutCreateInfo **out_create_info)

{
  bool bVar1;
  VkDescriptorSetLayoutCreateInfo *pVVar2;
  VkDescriptorSetLayoutBinding *pVVar3;
  VkSampler_T **ppVVar4;
  uint32_t i;
  ulong uVar5;
  long lVar6;
  
  pVVar2 = copy<VkDescriptorSetLayoutCreateInfo>(this,create_info,1,alloc);
  pVVar3 = copy<VkDescriptorSetLayoutBinding>
                     (this,pVVar2->pBindings,(ulong)pVVar2->bindingCount,alloc);
  pVVar2->pBindings = pVVar3;
  lVar6 = 0x10;
  for (uVar5 = 0; uVar5 < pVVar2->bindingCount; uVar5 = uVar5 + 1) {
    pVVar3 = pVVar2->pBindings;
    ppVVar4 = *(VkSampler_T ***)((long)&pVVar3->binding + lVar6);
    if ((ppVVar4 == (VkSampler_T **)0x0) || (1 < *(uint *)((long)pVVar3 + lVar6 + -0xc))) {
      ppVVar4 = (VkSampler_T **)0x0;
    }
    else {
      ppVVar4 = copy<VkSampler_T*>(this,ppVVar4,(ulong)*(uint *)((long)pVVar3 + lVar6 + -8),alloc);
    }
    *(VkSampler_T ***)((long)&pVVar3->binding + lVar6) = ppVVar4;
    lVar6 = lVar6 + 0x18;
  }
  bVar1 = copy_pnext_chain(this,create_info->pNext,alloc,&pVVar2->pNext,(DynamicStateInfo *)0x0,0);
  if (bVar1) {
    *out_create_info = pVVar2;
  }
  return bVar1;
}

Assistant:

bool StateRecorder::Impl::copy_descriptor_set_layout(
	const VkDescriptorSetLayoutCreateInfo *create_info, ScratchAllocator &alloc,
	VkDescriptorSetLayoutCreateInfo **out_create_info)
{
	auto *info = copy(create_info, 1, alloc);
	info->pBindings = copy(info->pBindings, info->bindingCount, alloc);

	for (uint32_t i = 0; i < info->bindingCount; i++)
	{
		auto &b = const_cast<VkDescriptorSetLayoutBinding &>(info->pBindings[i]);
		if (b.pImmutableSamplers &&
		    (b.descriptorType == VK_DESCRIPTOR_TYPE_SAMPLER ||
		     b.descriptorType == VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER))
		{
			b.pImmutableSamplers = copy(b.pImmutableSamplers, b.descriptorCount, alloc);
		}
		else
		{
			b.pImmutableSamplers = nullptr;
		}
	}

	if (!copy_pnext_chain(create_info->pNext, alloc, &info->pNext, nullptr, 0))
		return false;

	*out_create_info = info;
	return true;
}